

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O2

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::CopyFrom
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZMatrix<double> *mat)

{
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *pTVar1;
  
  if (mat != (TPZMatrix<double> *)0x0) {
    pTVar1 = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
             __dynamic_cast(mat,&TPZMatrix<double>::typeinfo,
                            &TPZFrontMatrix<double,TPZStackEqnStorage<double>,TPZFrontNonSym<double>>
                             ::typeinfo,0);
    if (pTVar1 != (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)0x0
       ) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontMatrix<double, TPZStackEqnStorage<double>, TPZFrontNonSym<double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = double, store = TPZStackEqnStorage<double>, front = TPZFrontNonSym<double>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }